

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.h
# Opt level: O2

bool __thiscall
PairedEnd::Reader<DNA>::Read(Reader<DNA> *this,Sequence<DNA> *fwd,Sequence<DNA> *rev)

{
  bool bVar1;
  
  bVar1 = EndOfFile(this);
  if (!bVar1) {
    FASTQ::Reader<DNA>::operator>>(&this->mFwdReader,fwd);
    FASTQ::Reader<DNA>::operator>>(&this->mRevReader,rev);
  }
  return !bVar1;
}

Assistant:

bool Read( Sequence< Alphabet >* fwd, Sequence< Alphabet >* rev ) {
    if( EndOfFile() )
      return false;

    mFwdReader >> *fwd;
    mRevReader >> *rev;

    return true;
  }